

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ErrorFinish(sqlite3 *db,int err_code)

{
  Mem *p;
  _func_int_sqlite3_vfs_ptr_int_char_ptr *p_Var1;
  int iVar2;
  
  p = db->pErr;
  if (p != (Mem *)0x0) {
    if ((p->flags & 0x2400) == 0) {
      p->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(p);
    }
  }
  if ((err_code & 0xfbU) == 10 && err_code != 0xc0a) {
    p_Var1 = db->pVfs->xGetLastError;
    if (p_Var1 == (_func_int_sqlite3_vfs_ptr_int_char_ptr *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*p_Var1)(db->pVfs,0,(char *)0x0);
    }
    db->iSysErrno = iVar2;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void  sqlite3ErrorFinish(sqlite3 *db, int err_code){
  if( db->pErr ) sqlite3ValueSetNull(db->pErr);
  sqlite3SystemError(db, err_code);
}